

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Multiband.cpp
# Opt level: O2

float __thiscall Multiband::CompressorChannel::Process(CompressorChannel *this,float input)

{
  float fVar1;
  float fVar2;
  
  fVar1 = ((ABS(input * input + -1e-11) - ABS(input * input + -100.0)) + 100.0) * 0.5;
  fVar2 = this->env;
  fVar2 = (fVar1 - fVar2) * (&this->atk)[fVar1 <= fVar2] + 1e-16 + fVar2;
  this->env = fVar2;
  fVar2 = log10f(fVar2);
  fVar2 = fVar2 * 10.0 - this->thr;
  if (this->knee <= ABS(fVar2)) {
    if (fVar2 <= 0.0) {
      fVar2 = 1.0;
      goto LAB_0011401f;
    }
    fVar1 = this->exp2;
  }
  else {
    fVar2 = fVar2 + this->knee;
    fVar1 = this->exp1;
    fVar2 = fVar2 * fVar2;
  }
  fVar2 = powf(fVar1,fVar2);
LAB_0011401f:
  this->reduction = fVar2;
  return input * fVar2;
}

Assistant:

inline float Process(float input)
        {
            float g = 1.0f;
            float s = FastClip(input * input, 1.0e-11f, 100.0f);
            float timeConst = (s > env) ? atk : rel;
            env += (s - env) * timeConst + 1.0e-16f; // add small constant to always positive number to avoid denormal numbers
            float sideChainLevel = 10.0f * log10f(env); // multiply by 10 (not 20) because duckEnvelope is RMS
            float t = sideChainLevel - thr;
            if (fabsf(t) < knee)
            {
                t += knee;
                g = powf(exp1, t * t);
            }
            else if (t > 0.0f)
                g = powf(exp2, t);
            reduction = g;
            return input * g;
        }